

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int gen_publickey_from_dsa_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,EVP_PKEY *pk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  uchar *buf;
  uchar *puVar6;
  BIGNUM *local_70;
  uchar **local_68;
  size_t *local_60;
  uchar **local_58;
  size_t *local_50;
  BIGNUM *g;
  BIGNUM *q;
  BIGNUM *p_bn;
  
  puVar5 = (uchar *)(*session->alloc)(7,&session->abstract);
  if (puVar5 != (uchar *)0x0) {
    local_68 = method;
    local_60 = method_len;
    local_58 = pubkeydata;
    local_50 = pubkeydata_len;
    EVP_PKEY_get_bn_param(pk,"p",&p_bn);
    EVP_PKEY_get_bn_param(pk,"g",&q);
    EVP_PKEY_get_bn_param(pk,"q",&g);
    EVP_PKEY_get_bn_param(pk,"pub",&local_70);
    iVar1 = BN_num_bits((BIGNUM *)p_bn);
    iVar1 = (iVar1 + 7) / 8;
    iVar2 = BN_num_bits((BIGNUM *)q);
    iVar2 = (iVar2 + 7) / 8;
    iVar3 = BN_num_bits((BIGNUM *)g);
    iVar3 = (iVar3 + 7) / 8;
    iVar4 = BN_num_bits(local_70);
    iVar4 = (iVar4 + 7) / 8;
    buf = (uchar *)(*session->alloc)((long)(iVar3 + iVar1 + iVar2 + iVar4 + 0x1f),&session->abstract
                                    );
    if (buf != (uchar *)0x0) {
      _libssh2_htonu32(buf,7);
      builtin_memcpy(buf + 4,"ssh-dss",7);
      puVar6 = write_bn(buf + 0xb,p_bn,iVar1 + 1);
      puVar6 = write_bn(puVar6,q,iVar2 + 1);
      puVar6 = write_bn(puVar6,g,iVar3 + 1);
      puVar6 = write_bn(puVar6,(BIGNUM *)local_70,iVar4 + 1);
      builtin_memcpy(puVar5,"ssh-dss",7);
      *local_68 = puVar5;
      if (local_60 != (size_t *)0x0) {
        *local_60 = 7;
      }
      *local_58 = buf;
      if (local_50 == (size_t *)0x0) {
        return 0;
      }
      *local_50 = (long)puVar6 - (long)buf;
      return 0;
    }
    (*session->free)(puVar5,&session->abstract);
  }
  iVar1 = _libssh2_error(session,-6,"Unable to allocate memory for private key data");
  return iVar1;
}

Assistant:

static int
gen_publickey_from_dsa_evp(LIBSSH2_SESSION *session,
                           unsigned char **method,
                           size_t *method_len,
                           unsigned char **pubkeydata,
                           size_t *pubkeydata_len,
                           EVP_PKEY *pk)
{
    libssh2_dsa_ctx *dsa = NULL;
    unsigned char *key;
    unsigned char *method_buf = NULL;
    size_t  key_len;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing public key from DSA private key envelope"));

#ifdef USE_OPENSSL_3
    dsa = pk;
#else
    dsa = EVP_PKEY_get1_DSA(pk);
#endif
    if(!dsa) {
        /* Assume memory allocation error... what else could it be ? */
        goto __alloc_error;
    }

    method_buf = LIBSSH2_ALLOC(session, 7);  /* ssh-dss. */
    if(!method_buf) {
        goto __alloc_error;
    }

    key = gen_publickey_from_dsa(session, dsa, &key_len);
    if(!key) {
        goto __alloc_error;
    }
#ifndef USE_OPENSSL_3
    DSA_free(dsa);
#endif

    memcpy(method_buf, "ssh-dss", 7);
    *method = method_buf;
    if(method_len) {
        *method_len = 7;
    }
    *pubkeydata = key;
    if(pubkeydata_len) {
        *pubkeydata_len = key_len;
    }
    return 0;

__alloc_error:
#ifndef USE_OPENSSL_3
    if(dsa) {
        DSA_free(dsa);
    }
#endif
    if(method_buf) {
        LIBSSH2_FREE(session, method_buf);
    }

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}